

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

string * __thiscall
google::protobuf::internal::ExtensionSet::GetString
          (ExtensionSet *this,int number,string *default_value)

{
  Extension *pEVar1;
  Nonnull<const_char_*> pcVar2;
  undefined1 *v1;
  undefined1 local_20 [16];
  
  pEVar1 = FindOrNull(this,number);
  if (pEVar1 == (Extension *)0x0) {
    return default_value;
  }
  if ((pEVar1->field_0xa & 2) != 0) {
    return default_value;
  }
  if (pEVar1->is_repeated == false) {
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       (0,1,
                        "(*extension).is_repeated ? REPEATED_FIELD : OPTIONAL_FIELD == OPTIONAL_FIELD"
                       );
  }
  if (pcVar2 != (Nonnull<const_char_*>)0x0) {
    GetString();
    goto LAB_00f85524;
  }
  if ((byte)(pEVar1->type - 0x13) < 0xee) {
    v1 = local_20;
    GetString();
LAB_00f85504:
    pcVar2 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                       ((long)v1,9,"cpp_type((*extension).type) == WireFormatLite::CPPTYPE_STRING");
  }
  else {
    v1 = (undefined1 *)
         (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar1->type * 4);
    if (v1 != &DAT_00000009) goto LAB_00f85504;
    pcVar2 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar2 == (Nonnull<const_char_*>)0x0) {
    return (string *)(pEVar1->field_0).int64_t_value;
  }
LAB_00f85524:
  GetString();
}

Assistant:

const std::string& ExtensionSet::GetString(
    int number, const std::string& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, STRING);
    return *extension->ptr.string_value;
  }
}